

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void SimpleHFilter16_C(uint8_t *p,int stride,int thresh)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = 0x10;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    iVar1 = NeedsFilter_C(p,1,thresh * 2 + 1);
    if (iVar1 != 0) {
      DoFilter2_C(p,1);
    }
    p = p + stride;
  }
  return;
}

Assistant:

static void SimpleHFilter16_C(uint8_t* p, int stride, int thresh) {
  int i;
  const int thresh2 = 2 * thresh + 1;
  for (i = 0; i < 16; ++i) {
    if (NeedsFilter_C(p + i * stride, 1, thresh2)) {
      DoFilter2_C(p + i * stride, 1);
    }
  }
}